

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  uint uVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_R8D;
  uint error;
  uchar filterType;
  size_t inindex;
  size_t outindex;
  size_t linebytes;
  size_t bytewidth;
  uchar *prevline;
  uint y;
  uint local_28;
  
  lodepng_get_raw_size_idat(in_EDX,1,in_R8D);
  local_28 = 0;
  while( true ) {
    if (in_ECX <= local_28) {
      return 0;
    }
    uVar1 = unfilterScanline(out,in,(uchar *)CONCAT44(w,h),CONCAT44(bpp,y),prevline._7_1_,bytewidth)
    ;
    if (uVar1 != 0) break;
    local_28 = local_28 + 1;
  }
  return uVar1;
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp) {
  /*
  For PNG filter method 0
  this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
  out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
  w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
  in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
  */

  unsigned y;
  unsigned char* prevline = 0;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  for (y = 0; y < h; ++y) {
    size_t outindex = linebytes * y;
    size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
    unsigned char filterType = in[inindex];

    CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

    prevline = &out[outindex];
  }

  return 0;
}